

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<true,false,false,true>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  Proof *this_00;
  bool bVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  SVOBitset *pSVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  uint g;
  HomomorphismModel *this_01;
  SVOBitset *other;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  int iVar35;
  int iVar36;
  conditional_t<true,_SVOBitset,_tuple<>_> before;
  NamedVertex local_140;
  NamedVertex local_118;
  NamedVertex local_f0;
  HomomorphismAssignment *local_c8;
  element_type *local_c0;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  
  bVar3 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,current_assignment->pattern_vertex,d->v);
  other = &d->values;
  local_38 = 0;
  SVOBitset::operator=((SVOBitset *)&local_b8,other);
  if ((bVar3 & 1) != 0) {
    pSVar5 = HomomorphismModel::forward_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(other,pSVar5);
  }
  bVar4 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,d->v,current_assignment->pattern_vertex);
  if ((bVar4 & 1) != 0) {
    pSVar5 = HomomorphismModel::reverse_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(other,pSVar5);
  }
  uVar7 = (ulong)local_38;
  uVar6 = &local_b8;
  if (0x10 < uVar7) {
    uVar6 = local_b8.short_data[0];
  }
  if (uVar7 == 0) {
    iVar35 = 0;
  }
  else {
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar26 = vpbroadcastq_avx512f();
    uVar8 = 0;
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar28 = auVar27;
      auVar27 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar27,auVar25);
      uVar2 = vpcmpuq_avx512f(auVar27,auVar26,2);
      auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar6 + uVar8 * 8));
      auVar33._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar27._8_8_;
      auVar33._0_8_ = (ulong)((byte)uVar2 & 1) * auVar27._0_8_;
      auVar33._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar27._16_8_;
      auVar33._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar27._24_8_;
      auVar33._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar27._32_8_;
      auVar33._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar27._40_8_;
      auVar33._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar27._48_8_;
      auVar33._56_8_ = (uVar2 >> 7) * auVar27._56_8_;
      uVar8 = uVar8 + 8;
      auVar27 = vpopcntq_avx512_vpopcntdq(auVar33);
      auVar17 = vpmovqd_avx512f(auVar27);
      auVar17 = vpaddd_avx2(auVar28._0_32_,auVar17);
      auVar27 = ZEXT3264(auVar17);
    } while ((uVar7 + 7 & 0x1fffffff8) != uVar8);
    auVar17 = vmovdqa32_avx512vl(auVar17);
    bVar1 = (bool)((byte)uVar2 & 1);
    auVar9._0_4_ = (uint)bVar1 * auVar17._0_4_ | (uint)!bVar1 * auVar28._0_4_;
    bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar9._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar28._4_4_;
    bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar9._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar28._8_4_;
    bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar9._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar28._12_4_;
    bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar28._16_4_;
    auVar18._0_16_ = auVar9;
    bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar28._20_4_;
    bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar28._24_4_;
    bVar1 = SUB81(uVar2 >> 7,0);
    auVar18._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar28._28_4_;
    auVar9 = vphaddd_avx(auVar18._16_16_,auVar9);
    auVar9 = vphaddd_avx(auVar9,auVar9);
    auVar9 = vphaddd_avx(auVar9,auVar9);
    iVar35 = auVar9._0_4_;
  }
  uVar7 = (ulong)(d->values).n_words;
  pSVar5 = other;
  if (0x10 < uVar7) {
    pSVar5 = (SVOBitset *)(d->values)._data.short_data[0];
  }
  if (uVar7 == 0) {
    iVar36 = 0;
  }
  else {
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar26 = vpbroadcastq_avx512f();
    uVar8 = 0;
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar33 = auVar27;
      auVar27 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar27,auVar25);
      uVar2 = vpcmpuq_avx512f(auVar27,auVar26,2);
      auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar5->_data + uVar8 * 8));
      auVar28._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar27._8_8_;
      auVar28._0_8_ = (ulong)((byte)uVar2 & 1) * auVar27._0_8_;
      auVar28._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar27._16_8_;
      auVar28._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar27._24_8_;
      auVar28._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar27._32_8_;
      auVar28._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar27._40_8_;
      auVar28._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar27._48_8_;
      auVar28._56_8_ = (uVar2 >> 7) * auVar27._56_8_;
      uVar8 = uVar8 + 8;
      auVar27 = vpopcntq_avx512_vpopcntdq(auVar28);
      auVar17 = vpmovqd_avx512f(auVar27);
      auVar17 = vpaddd_avx2(auVar33._0_32_,auVar17);
      auVar27 = ZEXT3264(auVar17);
    } while ((uVar7 + 7 & 0x1fffffff8) != uVar8);
    auVar18 = vmovdqa32_avx512vl(auVar17);
    bVar1 = (bool)((byte)uVar2 & 1);
    auVar10._0_4_ = (uint)bVar1 * auVar18._0_4_ | (uint)!bVar1 * auVar33._0_4_;
    bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar10._4_4_ = (uint)bVar1 * auVar18._4_4_ | (uint)!bVar1 * auVar33._4_4_;
    bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar10._8_4_ = (uint)bVar1 * auVar18._8_4_ | (uint)!bVar1 * auVar33._8_4_;
    bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar10._12_4_ = (uint)bVar1 * auVar18._12_4_ | (uint)!bVar1 * auVar33._12_4_;
    bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar1 * auVar18._16_4_ | (uint)!bVar1 * auVar33._16_4_;
    auVar17._0_16_ = auVar10;
    bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar1 * auVar18._20_4_ | (uint)!bVar1 * auVar33._20_4_;
    bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar1 * auVar18._24_4_ | (uint)!bVar1 * auVar33._24_4_;
    bVar1 = SUB81(uVar2 >> 7,0);
    auVar17._28_4_ = (uint)bVar1 * auVar18._28_4_ | (uint)!bVar1 * auVar33._28_4_;
    auVar9 = vphaddd_avx(auVar17._16_16_,auVar10);
    auVar9 = vphaddd_avx(auVar9,auVar9);
    auVar9 = vphaddd_avx(auVar9,auVar9);
    iVar36 = auVar9._0_4_;
  }
  if (iVar35 != iVar36) {
    this_00 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
              (&local_118,this->model,current_assignment->pattern_vertex);
    HomomorphismModel::target_vertex_for_proof_abi_cxx11_
              (&local_140,this->model,current_assignment->target_vertex);
    uVar7 = (ulong)local_38;
    uVar6 = local_b8.long_data;
    if (uVar7 < 0x11) {
      uVar6 = &local_b8;
    }
    if (uVar7 == 0) {
      iVar35 = 0;
    }
    else {
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar26 = vpbroadcastq_avx512f();
      uVar8 = 0;
      auVar27 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar33 = auVar27;
        auVar27 = vpbroadcastq_avx512f();
        auVar27 = vporq_avx512f(auVar27,auVar25);
        uVar2 = vpcmpuq_avx512f(auVar27,auVar26,2);
        auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar6 + uVar8 * 8));
        auVar29._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar27._8_8_;
        auVar29._0_8_ = (ulong)((byte)uVar2 & 1) * auVar27._0_8_;
        auVar29._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar27._16_8_;
        auVar29._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar27._24_8_;
        auVar29._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar27._32_8_;
        auVar29._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar27._40_8_;
        auVar29._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar27._48_8_;
        auVar29._56_8_ = (uVar2 >> 7) * auVar27._56_8_;
        uVar8 = uVar8 + 8;
        auVar27 = vpopcntq_avx512_vpopcntdq(auVar29);
        auVar17 = vpmovqd_avx512f(auVar27);
        auVar17 = vpaddd_avx2(auVar33._0_32_,auVar17);
        auVar27 = ZEXT3264(auVar17);
      } while ((uVar7 + 7 & 0x1fffffff8) != uVar8);
      auVar17 = vmovdqa32_avx512vl(auVar17);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar11._0_4_ = (uint)bVar1 * auVar17._0_4_ | (uint)!bVar1 * auVar33._0_4_;
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar11._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar33._4_4_;
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar11._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar33._8_4_;
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar11._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar33._12_4_;
      bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar19._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar33._16_4_;
      auVar19._0_16_ = auVar11;
      bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar19._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar33._20_4_;
      bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar19._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar33._24_4_;
      bVar1 = SUB81(uVar2 >> 7,0);
      auVar19._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar33._28_4_;
      auVar9 = vphaddd_avx(auVar19._16_16_,auVar11);
      auVar9 = vphaddd_avx(auVar9,auVar9);
      auVar9 = vphaddd_avx(auVar9,auVar9);
      iVar35 = auVar9._0_4_;
    }
    uVar7 = (ulong)(d->values).n_words;
    pSVar5 = other;
    if (0x10 < uVar7) {
      pSVar5 = (SVOBitset *)(d->values)._data.short_data[0];
    }
    if (uVar7 == 0) {
      iVar36 = 0;
    }
    else {
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar26 = vpbroadcastq_avx512f();
      uVar8 = 0;
      auVar27 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar33 = auVar27;
        auVar27 = vpbroadcastq_avx512f();
        auVar27 = vporq_avx512f(auVar27,auVar25);
        uVar2 = vpcmpuq_avx512f(auVar27,auVar26,2);
        auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar5->_data + uVar8 * 8));
        auVar30._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar27._8_8_;
        auVar30._0_8_ = (ulong)((byte)uVar2 & 1) * auVar27._0_8_;
        auVar30._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar27._16_8_;
        auVar30._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar27._24_8_;
        auVar30._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar27._32_8_;
        auVar30._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar27._40_8_;
        auVar30._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar27._48_8_;
        auVar30._56_8_ = (uVar2 >> 7) * auVar27._56_8_;
        uVar8 = uVar8 + 8;
        auVar27 = vpopcntq_avx512_vpopcntdq(auVar30);
        auVar17 = vpmovqd_avx512f(auVar27);
        auVar17 = vpaddd_avx2(auVar33._0_32_,auVar17);
        auVar27 = ZEXT3264(auVar17);
      } while ((uVar7 + 7 & 0x1fffffff8) != uVar8);
      auVar17 = vmovdqa32_avx512vl(auVar17);
      bVar1 = (bool)((byte)uVar2 & 1);
      auVar12._0_4_ = (uint)bVar1 * auVar17._0_4_ | (uint)!bVar1 * auVar33._0_4_;
      bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar12._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar33._4_4_;
      bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
      auVar12._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar33._8_4_;
      bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
      auVar12._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar33._12_4_;
      bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
      auVar20._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar33._16_4_;
      auVar20._0_16_ = auVar12;
      bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
      auVar20._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar33._20_4_;
      bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
      auVar20._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar33._24_4_;
      bVar1 = SUB81(uVar2 >> 7,0);
      auVar20._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar33._28_4_;
      auVar9 = vphaddd_avx(auVar20._16_16_,auVar12);
      auVar9 = vphaddd_avx(auVar9,auVar9);
      auVar9 = vphaddd_avx(auVar9,auVar9);
      iVar36 = auVar9._0_4_;
    }
    HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_(&local_f0,this->model,d->v);
    Proof::propagated(this_00,&local_118,&local_140,0,iVar35 - iVar36,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.second._M_dataplus._M_p != &local_f0.second.field_2) {
      operator_delete(local_f0.second._M_dataplus._M_p,
                      local_f0.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.second._M_dataplus._M_p != &local_140.second.field_2) {
      operator_delete(local_140.second._M_dataplus._M_p,
                      local_140.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.second._M_dataplus._M_p != &local_118.second.field_2) {
      operator_delete(local_118.second._M_dataplus._M_p,
                      local_118.second.field_2._M_allocated_capacity + 1);
    }
  }
  SVOBitset::operator=((SVOBitset *)&local_b8,other);
  this_01 = this->model;
  if (1 < this_01->max_graphs) {
    g = 1;
    local_c8 = current_assignment;
    do {
      if ((bVar3 >> (g & 0x1f) & 1) != 0) {
        pSVar5 = HomomorphismModel::target_graph_row(this_01,g,current_assignment->target_vertex);
        SVOBitset::operator&=(other,pSVar5);
      }
      uVar7 = (ulong)local_38;
      uVar6 = &local_b8;
      if (0x10 < uVar7) {
        uVar6 = local_b8.long_data;
      }
      if (uVar7 == 0) {
        iVar35 = 0;
      }
      else {
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar26 = vpbroadcastq_avx512f();
        uVar8 = 0;
        auVar27 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar33 = auVar27;
          auVar27 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar27,auVar25);
          uVar2 = vpcmpuq_avx512f(auVar27,auVar26,2);
          auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar6 + uVar8 * 8));
          auVar31._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar27._8_8_;
          auVar31._0_8_ = (ulong)((byte)uVar2 & 1) * auVar27._0_8_;
          auVar31._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar27._16_8_;
          auVar31._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar27._24_8_;
          auVar31._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar27._32_8_;
          auVar31._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar27._40_8_;
          auVar31._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar27._48_8_;
          auVar31._56_8_ = (uVar2 >> 7) * auVar27._56_8_;
          uVar8 = uVar8 + 8;
          auVar27 = vpopcntq_avx512_vpopcntdq(auVar31);
          auVar17 = vpmovqd_avx512f(auVar27);
          auVar17 = vpaddd_avx2(auVar33._0_32_,auVar17);
          auVar27 = ZEXT3264(auVar17);
        } while ((uVar7 + 7 & 0x1fffffff8) != uVar8);
        auVar17 = vmovdqa32_avx512vl(auVar17);
        bVar1 = (bool)((byte)uVar2 & 1);
        auVar13._0_4_ = (uint)bVar1 * auVar17._0_4_ | (uint)!bVar1 * auVar33._0_4_;
        bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
        auVar13._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar33._4_4_;
        bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
        auVar13._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar33._8_4_;
        bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
        auVar13._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar33._12_4_;
        bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
        auVar21._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar33._16_4_;
        auVar21._0_16_ = auVar13;
        bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
        auVar21._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar33._20_4_;
        bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
        auVar21._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar33._24_4_;
        bVar1 = SUB81(uVar2 >> 7,0);
        auVar21._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar33._28_4_;
        auVar9 = vphaddd_avx(auVar21._16_16_,auVar13);
        auVar9 = vphaddd_avx(auVar9,auVar9);
        auVar9 = vphaddd_avx(auVar9,auVar9);
        iVar35 = auVar9._0_4_;
      }
      uVar7 = (ulong)(d->values).n_words;
      pSVar5 = other;
      if (0x10 < uVar7) {
        pSVar5 = (SVOBitset *)(d->values)._data.short_data[0];
      }
      if (uVar7 == 0) {
        iVar36 = 0;
      }
      else {
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar26 = vpbroadcastq_avx512f();
        uVar8 = 0;
        auVar27 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar33 = auVar27;
          auVar27 = vpbroadcastq_avx512f();
          auVar27 = vporq_avx512f(auVar27,auVar25);
          uVar2 = vpcmpuq_avx512f(auVar27,auVar26,2);
          auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar5->_data + uVar8 * 8));
          auVar32._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar27._8_8_;
          auVar32._0_8_ = (ulong)((byte)uVar2 & 1) * auVar27._0_8_;
          auVar32._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar27._16_8_;
          auVar32._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar27._24_8_;
          auVar32._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar27._32_8_;
          auVar32._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar27._40_8_;
          auVar32._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar27._48_8_;
          auVar32._56_8_ = (uVar2 >> 7) * auVar27._56_8_;
          uVar8 = uVar8 + 8;
          auVar27 = vpopcntq_avx512_vpopcntdq(auVar32);
          auVar17 = vpmovqd_avx512f(auVar27);
          auVar17 = vpaddd_avx2(auVar33._0_32_,auVar17);
          auVar27 = ZEXT3264(auVar17);
        } while ((uVar7 + 7 & 0x1fffffff8) != uVar8);
        auVar17 = vmovdqa32_avx512vl(auVar17);
        bVar1 = (bool)((byte)uVar2 & 1);
        auVar14._0_4_ = (uint)bVar1 * auVar17._0_4_ | (uint)!bVar1 * auVar33._0_4_;
        bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
        auVar14._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar33._4_4_;
        bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
        auVar14._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar33._8_4_;
        bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
        auVar14._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar33._12_4_;
        bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
        auVar22._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar33._16_4_;
        auVar22._0_16_ = auVar14;
        bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
        auVar22._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar33._20_4_;
        bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
        auVar22._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar33._24_4_;
        bVar1 = SUB81(uVar2 >> 7,0);
        auVar22._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar33._28_4_;
        auVar9 = vphaddd_avx(auVar22._16_16_,auVar14);
        auVar9 = vphaddd_avx(auVar9,auVar9);
        auVar9 = vphaddd_avx(auVar9,auVar9);
        iVar36 = auVar9._0_4_;
      }
      if (iVar35 != iVar36) {
        local_c0 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  (&local_118,this->model,current_assignment->pattern_vertex);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  (&local_140,this->model,current_assignment->target_vertex);
        uVar7 = (ulong)local_38;
        uVar6 = &local_b8;
        if (0x10 < uVar7) {
          uVar6 = local_b8.long_data;
        }
        if (uVar7 == 0) {
          iVar35 = 0;
        }
        else {
          auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar26 = vpbroadcastq_avx512f();
          uVar8 = 0;
          auVar27 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar28 = auVar27;
            auVar27 = vpbroadcastq_avx512f();
            auVar27 = vporq_avx512f(auVar27,auVar25);
            uVar2 = vpcmpuq_avx512f(auVar27,auVar26,2);
            auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])(uVar6 + uVar8 * 8));
            auVar27._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar33._8_8_;
            auVar27._0_8_ = (ulong)((byte)uVar2 & 1) * auVar33._0_8_;
            auVar27._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar33._16_8_;
            auVar27._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar33._24_8_;
            auVar27._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar33._32_8_;
            auVar27._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar33._40_8_;
            auVar27._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar33._48_8_;
            auVar27._56_8_ = (uVar2 >> 7) * auVar33._56_8_;
            uVar8 = uVar8 + 8;
            auVar27 = vpopcntq_avx512_vpopcntdq(auVar27);
            auVar17 = vpmovqd_avx512f(auVar27);
            auVar17 = vpaddd_avx2(auVar28._0_32_,auVar17);
            auVar27 = ZEXT3264(auVar17);
          } while ((uVar7 + 7 & 0x1fffffff8) != uVar8);
          auVar17 = vmovdqa32_avx512vl(auVar17);
          bVar1 = (bool)((byte)uVar2 & 1);
          auVar15._0_4_ = (uint)bVar1 * auVar17._0_4_ | (uint)!bVar1 * auVar28._0_4_;
          bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
          auVar15._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar28._4_4_;
          bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
          auVar15._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar28._8_4_;
          bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
          auVar15._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar28._12_4_;
          bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
          auVar23._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar28._16_4_;
          auVar23._0_16_ = auVar15;
          bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
          auVar23._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar28._20_4_;
          bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
          auVar23._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar28._24_4_;
          bVar1 = SUB81(uVar2 >> 7,0);
          auVar23._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar28._28_4_;
          auVar9 = vphaddd_avx(auVar23._16_16_,auVar15);
          auVar9 = vphaddd_avx(auVar9,auVar9);
          auVar9 = vphaddd_avx(auVar9,auVar9);
          iVar35 = auVar9._0_4_;
        }
        uVar7 = (ulong)(d->values).n_words;
        pSVar5 = other;
        if (0x10 < uVar7) {
          pSVar5 = (SVOBitset *)(d->values)._data.short_data[0];
        }
        if (uVar7 == 0) {
          iVar36 = 0;
        }
        else {
          auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar26 = vpbroadcastq_avx512f();
          uVar8 = 0;
          auVar27 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar33 = auVar27;
            auVar27 = vpbroadcastq_avx512f();
            auVar27 = vporq_avx512f(auVar27,auVar25);
            uVar2 = vpcmpuq_avx512f(auVar27,auVar26,2);
            auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)&pSVar5->_data + uVar8 * 8));
            auVar34._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar27._8_8_;
            auVar34._0_8_ = (ulong)((byte)uVar2 & 1) * auVar27._0_8_;
            auVar34._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar27._16_8_;
            auVar34._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar27._24_8_;
            auVar34._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar27._32_8_;
            auVar34._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar27._40_8_;
            auVar34._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar27._48_8_;
            auVar34._56_8_ = (uVar2 >> 7) * auVar27._56_8_;
            uVar8 = uVar8 + 8;
            auVar27 = vpopcntq_avx512_vpopcntdq(auVar34);
            auVar17 = vpmovqd_avx512f(auVar27);
            auVar17 = vpaddd_avx2(auVar33._0_32_,auVar17);
            auVar27 = ZEXT3264(auVar17);
          } while ((uVar7 + 7 & 0x1fffffff8) != uVar8);
          auVar17 = vmovdqa32_avx512vl(auVar17);
          bVar1 = (bool)((byte)uVar2 & 1);
          auVar16._0_4_ = (uint)bVar1 * auVar17._0_4_ | (uint)!bVar1 * auVar33._0_4_;
          bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
          auVar16._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar33._4_4_;
          bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
          auVar16._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar33._8_4_;
          bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
          auVar16._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar33._12_4_;
          bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
          auVar24._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar33._16_4_;
          auVar24._0_16_ = auVar16;
          bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
          auVar24._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar33._20_4_;
          bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
          auVar24._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar33._24_4_;
          bVar1 = SUB81(uVar2 >> 7,0);
          auVar24._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar33._28_4_;
          auVar9 = vphaddd_avx(auVar24._16_16_,auVar16);
          auVar9 = vphaddd_avx(auVar9,auVar9);
          auVar9 = vphaddd_avx(auVar9,auVar9);
          iVar36 = auVar9._0_4_;
        }
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_(&local_f0,this->model,d->v);
        Proof::propagated(local_c0,&local_118,&local_140,g,iVar35 - iVar36,&local_f0);
        current_assignment = local_c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.second._M_dataplus._M_p != &local_f0.second.field_2) {
          operator_delete(local_f0.second._M_dataplus._M_p,
                          local_f0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140.second._M_dataplus._M_p != &local_140.second.field_2) {
          operator_delete(local_140.second._M_dataplus._M_p,
                          local_140.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.second._M_dataplus._M_p != &local_118.second.field_2) {
          operator_delete(local_118.second._M_dataplus._M_p,
                          local_118.second.field_2._M_allocated_capacity + 1);
        }
      }
      SVOBitset::operator=((SVOBitset *)&local_b8,other);
      this_01 = this->model;
      g = g + 1;
    } while (g < this_01->max_graphs);
  }
  if ((0x10 < local_38) &&
     ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
      (anon_union_128_2_84168a9f_for__data *)0x0)) {
    operator_delete__(local_b8.long_data);
  }
  return;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}